

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiskin.cpp
# Opt level: O3

bool parseArgs(int argn,char **argv,Parameters *params)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  char **ppcVar6;
  string arg3;
  string arg4;
  string arg5;
  allocator local_91;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (argn - 7U < 0xfffffffc) {
    return false;
  }
  uVar1 = atoi(argv[1]);
  uVar2 = atoi(argv[2]);
  if (argn == 6) {
    std::__cxx11::string::string((string *)local_90,argv[3],(allocator *)local_70);
    std::__cxx11::string::string((string *)local_70,argv[4],(allocator *)local_50);
    std::__cxx11::string::string((string *)local_50,argv[5],&local_91);
    iVar4 = std::__cxx11::string::compare((char *)local_90);
    if ((iVar4 == 0) && (iVar4 = std::__cxx11::string::compare((char *)local_50), iVar4 == 0)) {
      ppcVar6 = argv + 4;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)local_90);
      if ((iVar4 != 0) || (iVar4 = std::__cxx11::string::compare((char *)local_70), iVar4 != 0)) {
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
        goto LAB_00104999;
      }
      ppcVar6 = argv + 5;
    }
    iVar4 = atoi(*ppcVar6);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    if (local_90[0] != local_80) {
LAB_001049b3:
      operator_delete(local_90[0]);
    }
LAB_001049b8:
    bVar5 = true;
LAB_001049ba:
    if (uVar1 % uVar2 == 0) {
      (params->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_int,_bool>).
      super__Head_base<0UL,_unsigned_int,_false>._M_head_impl = uVar1;
      (params->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_int,_bool>).
      super__Tuple_impl<1UL,_unsigned_int,_int,_bool>.super__Head_base<1UL,_unsigned_int,_false>.
      _M_head_impl = uVar2;
      (params->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_int,_bool>).
      super__Tuple_impl<1UL,_unsigned_int,_int,_bool>.super__Tuple_impl<2UL,_int,_bool>.
      super__Head_base<2UL,_int,_false>._M_head_impl = iVar4;
      (params->super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_int,_bool>).
      super__Tuple_impl<1UL,_unsigned_int,_int,_bool>.super__Tuple_impl<2UL,_int,_bool>.
      super__Tuple_impl<3UL,_bool>.super__Head_base<3UL,_bool,_false>._M_head_impl = bVar5;
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "The length of vector must be multiple of number of processors!\n",0x3f);
  }
  else {
    if (argn == 5) {
      std::__cxx11::string::string((string *)local_90,argv[3],(allocator *)local_70);
      iVar4 = std::__cxx11::string::compare((char *)local_90);
      if (iVar4 == 0) {
        iVar4 = atoi(argv[4]);
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
        goto LAB_001048d7;
      }
LAB_00104999:
      if (local_90[0] == local_80) {
        return false;
      }
    }
    else {
      iVar4 = -1;
      if (argn != 4) {
LAB_001048d7:
        bVar5 = false;
        goto LAB_001049ba;
      }
      std::__cxx11::string::string((string *)local_90,argv[3],(allocator *)local_70);
      iVar3 = std::__cxx11::string::compare((char *)local_90);
      if (iVar3 == 0) {
        if (local_90[0] != local_80) goto LAB_001049b3;
        goto LAB_001049b8;
      }
      if (local_90[0] == local_80) {
        return false;
      }
    }
    operator_delete(local_90[0]);
  }
  return false;
}

Assistant:

bool parseArgs (int argn, char **argv, Parameters &params) {
	if (argn < 3 || argn > 6) {
		return false;
	}

	try {
		uint n			= std::atoi (argv[1]);
		uint p			= std::atoi (argv[2]);
		int seed		= -1;
		bool affinity	= false;

		
		if (argn == 4) {
			std::string arg3	= argv[3];
			if (arg3 == "-a")
				affinity	= true;
			else
				return false;
		}
		else if (argn == 5) {
			std::string arg3	= argv[3];
			if (arg3 == "-s")
				seed	= std::atoi (argv[4]);
			else
				return false;
		}
		else if (argn == 6) {
			std::string arg3	= argv[3];
			std::string arg4	= argv[4];
			std::string arg5	= argv[5];

			if (arg3 == "-s" && arg5 == "-a") {
				seed		= std::atoi (argv[4]);
				affinity	= true;
			}
			else if (arg3 == "-a" && arg4 == "-s") {
				seed		= std::atoi (argv[5]);
				affinity	= true;
			}
			else
				return false;
		}

		if (n%p != 0) {
			std::cerr << "The length of vector must be multiple of number of processors!\n";
			return false;
		}

		params	= Parameters (n, p, seed, affinity);

		return true;
	} catch (...) {
		return false;
	}
}